

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::buildComponentIdMap
          (ValidatorImpl *this,ComponentPtr *component,IdMap *idMap,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *reportedConnections)

{
  IssueImpl *pIVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  size_t sVar5;
  size_type sVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variable2;
  ulong uVar7;
  ulong uVar8;
  ValidatorImpl *pVVar9;
  string imported;
  string mappingId;
  string owning;
  string connectionId;
  ResetPtr item_1;
  string connectionDescription;
  string connection;
  VariablePtr item;
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ComponentPtr equivParent;
  VariablePtr equiv;
  string info;
  IssuePtr issue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  info._M_dataplus._M_p = (pointer)&info.field_2;
  info._M_string_length = 0;
  info.field_2._M_local_buf[0] = '\0';
  variable2 = reportedConnections;
  Entity::id_abi_cxx11_
            (&imported,
             (Entity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  sVar2 = imported._M_string_length;
  std::__cxx11::string::~string((string *)&imported);
  if (sVar2 != 0) {
    imported._M_dataplus._M_p = (pointer)&imported.field_2;
    imported._M_string_length = 0;
    owning._M_dataplus._M_p = (pointer)&owning.field_2;
    owning._M_string_length = 0;
    imported.field_2._M_local_buf[0] = '\0';
    owning.field_2._M_local_buf[0] = '\0';
    bVar4 = ImportedEntity::isImport
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ImportedEntity);
    if (bVar4) {
      std::__cxx11::string::assign((char *)&imported);
    }
    std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>
              ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
               &connectionId,
               &component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
    owningComponent((ParentedEntityConstPtr *)&mappingId);
    _Var3 = mappingId._M_dataplus;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mappingId._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&connectionId._M_string_length);
    if (_Var3._M_p == (pointer)0x0) {
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Component,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&item_1
                 ,&component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
      owningModel((ParentedEntityConstPtr *)&connectionDescription);
      NamedEntity::name_abi_cxx11_
                (&connection,(NamedEntity *)connectionDescription._M_dataplus._M_p);
      std::operator+(&connectionId,"\' in model \'",&connection);
      std::operator+(&mappingId,&connectionId,"\'");
    }
    else {
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Component,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&item_1
                 ,&component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
      owningComponent((ParentedEntityConstPtr *)&connectionDescription);
      NamedEntity::name_abi_cxx11_
                (&connection,(NamedEntity *)connectionDescription._M_dataplus._M_p);
      std::operator+(&connectionId,"\' in component \'",&connection);
      std::operator+(&mappingId,&connectionId,"\'");
    }
    std::__cxx11::string::operator=((string *)&owning,(string *)&mappingId);
    std::__cxx11::string::~string((string *)&mappingId);
    std::__cxx11::string::~string((string *)&connectionId);
    std::__cxx11::string::~string((string *)&connection);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&connectionDescription._M_string_length
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::operator+(&connectionDescription," - ",&imported);
    std::operator+(&connection,&connectionDescription,"component \'");
    NamedEntity::name_abi_cxx11_
              ((string *)&item_1,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&connectionId,&connection,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&item_1);
    std::operator+(&mappingId,&connectionId,&owning);
    std::__cxx11::string::operator=((string *)&info,(string *)&mappingId);
    std::__cxx11::string::~string((string *)&mappingId);
    std::__cxx11::string::~string((string *)&connectionId);
    std::__cxx11::string::~string((string *)&item_1);
    std::__cxx11::string::~string((string *)&connection);
    std::__cxx11::string::~string((string *)&connectionDescription);
    pVVar9 = (ValidatorImpl *)&mappingId;
    Entity::id_abi_cxx11_
              ((string *)pVVar9,
               (Entity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    variable2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)idMap;
    addIdMapItem(pVVar9,&mappingId,&info,idMap);
    std::__cxx11::string::~string((string *)&mappingId);
    std::__cxx11::string::~string((string *)&owning);
    std::__cxx11::string::~string((string *)&imported);
  }
  uVar8 = 0;
  while( true ) {
    sVar5 = Component::variableCount
                      ((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (sVar5 <= uVar8) break;
    Component::variable((Component *)&item,
                        (size_t)(component->
                                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    Entity::id_abi_cxx11_
              (&imported,
               (Entity *)
               item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar2 = imported._M_string_length;
    std::__cxx11::string::~string((string *)&imported);
    if (sVar2 != 0) {
      NamedEntity::name_abi_cxx11_
                (&connection,
                 &(item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_NamedEntity);
      std::operator+(&connectionId," - variable \'",&connection);
      std::operator+(&mappingId,&connectionId,"\' in component \'");
      NamedEntity::name_abi_cxx11_
                (&connectionDescription,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+(&owning,&mappingId,&connectionDescription);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imported,
                     &owning,"\'");
      std::__cxx11::string::operator=((string *)&info,(string *)&imported);
      std::__cxx11::string::~string((string *)&imported);
      std::__cxx11::string::~string((string *)&owning);
      std::__cxx11::string::~string((string *)&connectionDescription);
      std::__cxx11::string::~string((string *)&mappingId);
      std::__cxx11::string::~string((string *)&connectionId);
      std::__cxx11::string::~string((string *)&connection);
      pVVar9 = (ValidatorImpl *)&imported;
      Entity::id_abi_cxx11_
                (&imported,
                 (Entity *)
                 item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      variable2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)idMap;
      addIdMapItem(pVVar9,&imported,&info,idMap);
      std::__cxx11::string::~string((string *)&imported);
    }
    uVar7 = 0;
    while( true ) {
      sVar5 = Variable::equivalentVariableCount
                        (item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      if (sVar5 <= uVar7) break;
      Variable::equivalentVariable
                ((Variable *)&equiv,
                 (size_t)item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Variable,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                 &imported,(__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&equiv);
      owningComponent((ParentedEntityConstPtr *)&equivParent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&imported._M_string_length);
      if (equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        NamedEntity::name_abi_cxx11_
                  (&owning,&(item.
                             super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_NamedEntity);
        NamedEntity::name_abi_cxx11_
                  (&mappingId,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &imported,&owning,&mappingId);
        std::__cxx11::string::~string((string *)&mappingId);
        std::__cxx11::string::~string((string *)&owning);
        NamedEntity::name_abi_cxx11_
                  (&mappingId,
                   &(equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_NamedEntity);
        NamedEntity::name_abi_cxx11_
                  (&connectionId,
                   (NamedEntity *)
                   equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::operator+(&owning,&mappingId,&connectionId);
        std::__cxx11::string::~string((string *)&connectionId);
        std::__cxx11::string::~string((string *)&mappingId);
        Variable::equivalenceMappingId_abi_cxx11_
                  (&mappingId,(Variable *)&item,&equiv,(VariablePtr *)variable2);
        bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imported,&owning);
        if ((bVar4) && (mappingId._M_string_length != 0)) {
          NamedEntity::name_abi_cxx11_
                    (&local_f0,
                     &(item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_NamedEntity);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"between variable \'",&local_f0);
          std::operator+(&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &issue_1,"\' in component \'");
          NamedEntity::name_abi_cxx11_
                    (&local_90,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,&local_110,&local_90);
          std::operator+(&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue
                         ,"\' and variable \'");
          NamedEntity::name_abi_cxx11_
                    (&local_b0,
                     &(equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_NamedEntity);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &item_1,&local_198,&local_b0);
          std::operator+(&connectionDescription,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &item_1,"\' in component \'");
          NamedEntity::name_abi_cxx11_
                    (&local_d0,
                     (NamedEntity *)
                     equivParent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          std::operator+(&connection,&connectionDescription,&local_d0);
          std::operator+(&connectionId,&connection,"\'");
          std::__cxx11::string::~string((string *)&connection);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&connectionDescription);
          std::__cxx11::string::~string((string *)&item_1);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::~string((string *)&issue);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&issue_1);
          std::__cxx11::string::~string((string *)&local_f0);
          bVar4 = isValidXmlName(&mappingId);
          if (!bVar4) {
            Issue::IssueImpl::create();
            Issue::IssueImpl::setReferenceRule
                      ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,XML_ID_ATTRIBUTE);
            AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                      ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,&item,&equiv);
            pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                     ->mPimpl;
            std::operator+(&local_198,"Variable equivalence ",&connectionId);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &item_1,&local_198,
                           ", does not have a valid map_variables \'id\' attribute, \'");
            std::operator+(&connectionDescription,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &item_1,&mappingId);
            std::operator+(&connection,&connectionDescription,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&connection);
            std::__cxx11::string::~string((string *)&connection);
            std::__cxx11::string::~string((string *)&connectionDescription);
            std::__cxx11::string::~string((string *)&item_1);
            std::__cxx11::string::~string((string *)&local_198);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          pVVar9 = (ValidatorImpl *)&connection;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar9
                         ," - variable equivalence ",&connectionId);
          std::__cxx11::string::operator=((string *)&info,(string *)pVVar9);
          std::__cxx11::string::~string((string *)pVVar9);
          variable2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)idMap;
          addIdMapItem(pVVar9,&mappingId,&info,idMap);
          std::__cxx11::string::~string((string *)&connectionId);
        }
        Variable::equivalenceConnectionId_abi_cxx11_
                  (&connectionId,(Variable *)&item,&equiv,(VariablePtr *)variable2);
        NamedEntity::name_abi_cxx11_
                  (&connectionDescription,
                   (NamedEntity *)
                   (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr);
        NamedEntity::name_abi_cxx11_
                  ((string *)&item_1,
                   (NamedEntity *)
                   equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        bVar4 = std::operator<(&connectionDescription,(string *)&item_1);
        if (bVar4) {
          NamedEntity::name_abi_cxx11_
                    (&local_198,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          NamedEntity::name_abi_cxx11_
                    ((string *)&issue,
                     (NamedEntity *)
                     equivParent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          std::operator+(&connection,&local_198,(string *)&issue);
        }
        else {
          NamedEntity::name_abi_cxx11_
                    (&local_198,
                     (NamedEntity *)
                     equivParent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          NamedEntity::name_abi_cxx11_
                    ((string *)&issue,
                     (NamedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          std::operator+(&connection,&local_198,(string *)&issue);
        }
        std::__cxx11::string::~string((string *)&issue);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&item_1);
        std::__cxx11::string::~string((string *)&connectionDescription);
        bVar4 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imported,&owning);
        if ((bVar4) && (connectionId._M_string_length != 0)) {
          sVar6 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(reportedConnections,&connection);
          if (sVar6 == 0) {
            NamedEntity::name_abi_cxx11_
                      (&local_b0,
                       (NamedEntity *)
                       (component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ;
            std::operator+(&local_90,"between components \'",&local_b0);
            std::operator+(&local_f0,&local_90,"\' and \'");
            NamedEntity::name_abi_cxx11_
                      (&local_d0,
                       (NamedEntity *)
                       equivParent.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_1,&local_f0,&local_d0);
            std::operator+(&local_110,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_1,"\' because of variable equivalence between variables \'");
            NamedEntity::name_abi_cxx11_
                      (&local_50,
                       &(item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_NamedEntity);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue,&local_110,&local_50);
            std::operator+(&local_198,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue,"\' and \'");
            NamedEntity::name_abi_cxx11_
                      (&local_70,
                       &(equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_NamedEntity);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &item_1,&local_198,&local_70);
            std::operator+(&connectionDescription,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &item_1,"\'");
            std::__cxx11::string::~string((string *)&item_1);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&issue);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&issue_1);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
            bVar4 = isValidXmlName(&connectionId);
            if (!bVar4) {
              Issue::IssueImpl::create();
              Issue::IssueImpl::setReferenceRule
                        ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,XML_ID_ATTRIBUTE);
              AnyCellmlElement::AnyCellmlElementImpl::setConnection
                        ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,&item,&equiv);
              pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
              std::operator+(&local_110,"Connection ",&connectionDescription);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue,&local_110,
                             ", does not have a valid connection \'id\' attribute, \'");
              std::operator+(&local_198,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue,&connectionId);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &item_1,&local_198,"\'.");
              Issue::IssueImpl::setDescription
                        (pIVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&item_1);
              std::__cxx11::string::~string((string *)&item_1);
              std::__cxx11::string::~string((string *)&local_198);
              std::__cxx11::string::~string((string *)&issue);
              std::__cxx11::string::~string((string *)&local_110);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)reportedConnections,&connection);
            pVVar9 = (ValidatorImpl *)&item_1;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pVVar9," - connection ",&connectionDescription);
            std::__cxx11::string::operator=((string *)&info,(string *)pVVar9);
            std::__cxx11::string::~string((string *)pVVar9);
            variable2 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)idMap;
            addIdMapItem(pVVar9,&connectionId,&info,idMap);
            std::__cxx11::string::~string((string *)&connectionDescription);
          }
        }
        std::__cxx11::string::~string((string *)&connection);
        std::__cxx11::string::~string((string *)&connectionId);
        std::__cxx11::string::~string((string *)&mappingId);
        std::__cxx11::string::~string((string *)&owning);
        std::__cxx11::string::~string((string *)&imported);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equivParent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equiv.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      uVar7 = uVar7 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    uVar8 = uVar8 + 1;
  }
  uVar8 = 0;
  while( true ) {
    sVar5 = Component::resetCount
                      ((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (sVar5 <= uVar8) break;
    Component::reset((Component *)&item_1,
                     (size_t)(component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    Entity::id_abi_cxx11_
              (&imported,
               (Entity *)
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar2 = imported._M_string_length;
    std::__cxx11::string::~string((string *)&imported);
    if (sVar2 != 0) {
      std::__cxx11::to_string(&connection,uVar8);
      std::operator+(&connectionId," - reset at index ",&connection);
      std::operator+(&mappingId,&connectionId," in component \'");
      NamedEntity::name_abi_cxx11_
                (&connectionDescription,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+(&owning,&mappingId,&connectionDescription);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imported,
                     &owning,"\'");
      std::__cxx11::string::operator=((string *)&info,(string *)&imported);
      std::__cxx11::string::~string((string *)&imported);
      std::__cxx11::string::~string((string *)&owning);
      std::__cxx11::string::~string((string *)&connectionDescription);
      std::__cxx11::string::~string((string *)&mappingId);
      std::__cxx11::string::~string((string *)&connectionId);
      std::__cxx11::string::~string((string *)&connection);
      pVVar9 = (ValidatorImpl *)&imported;
      Entity::id_abi_cxx11_
                (&imported,
                 (Entity *)
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      addIdMapItem(pVVar9,&imported,&info,idMap);
      std::__cxx11::string::~string((string *)&imported);
    }
    Reset::testValueId_abi_cxx11_
              (&imported,
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar2 = imported._M_string_length;
    std::__cxx11::string::~string((string *)&imported);
    if (sVar2 != 0) {
      std::__cxx11::to_string(&connection,uVar8);
      std::operator+(&connectionId," - test_value in reset at index ",&connection);
      std::operator+(&mappingId,&connectionId," in component \'");
      NamedEntity::name_abi_cxx11_
                (&connectionDescription,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+(&owning,&mappingId,&connectionDescription);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imported,
                     &owning,"\'");
      std::__cxx11::string::operator=((string *)&info,(string *)&imported);
      std::__cxx11::string::~string((string *)&imported);
      std::__cxx11::string::~string((string *)&owning);
      std::__cxx11::string::~string((string *)&connectionDescription);
      std::__cxx11::string::~string((string *)&mappingId);
      std::__cxx11::string::~string((string *)&connectionId);
      std::__cxx11::string::~string((string *)&connection);
      pVVar9 = (ValidatorImpl *)&imported;
      Reset::testValueId_abi_cxx11_
                (&imported,
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      addIdMapItem(pVVar9,&imported,&info,idMap);
      std::__cxx11::string::~string((string *)&imported);
    }
    std::__cxx11::to_string(&connection,uVar8);
    std::operator+(&connectionId,"test_value in reset ",&connection);
    std::operator+(&mappingId,&connectionId," in component \'");
    NamedEntity::name_abi_cxx11_
              (&connectionDescription,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&owning,&mappingId,&connectionDescription);
    std::operator+(&imported,&owning,"\'");
    std::__cxx11::string::operator=((string *)&info,(string *)&imported);
    std::__cxx11::string::~string((string *)&imported);
    std::__cxx11::string::~string((string *)&owning);
    std::__cxx11::string::~string((string *)&connectionDescription);
    std::__cxx11::string::~string((string *)&mappingId);
    std::__cxx11::string::~string((string *)&connectionId);
    std::__cxx11::string::~string((string *)&connection);
    Reset::testValue_abi_cxx11_
              (&imported,
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    buildMathIdMap(this,&info,idMap,&imported);
    std::__cxx11::string::~string((string *)&imported);
    Reset::resetValueId_abi_cxx11_
              (&imported,
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    sVar2 = imported._M_string_length;
    std::__cxx11::string::~string((string *)&imported);
    if (sVar2 != 0) {
      std::__cxx11::to_string(&connection,uVar8);
      std::operator+(&connectionId," - reset_value in reset at index ",&connection);
      std::operator+(&mappingId,&connectionId," in component \'");
      NamedEntity::name_abi_cxx11_
                (&connectionDescription,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+(&owning,&mappingId,&connectionDescription);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imported,
                     &owning,"\'");
      std::__cxx11::string::operator=((string *)&info,(string *)&imported);
      std::__cxx11::string::~string((string *)&imported);
      std::__cxx11::string::~string((string *)&owning);
      std::__cxx11::string::~string((string *)&connectionDescription);
      std::__cxx11::string::~string((string *)&mappingId);
      std::__cxx11::string::~string((string *)&connectionId);
      std::__cxx11::string::~string((string *)&connection);
      pVVar9 = (ValidatorImpl *)&imported;
      Reset::resetValueId_abi_cxx11_
                (&imported,
                 item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      addIdMapItem(pVVar9,&imported,&info,idMap);
      std::__cxx11::string::~string((string *)&imported);
    }
    std::__cxx11::to_string(&connection,uVar8);
    std::operator+(&connectionId,"reset_value in reset ",&connection);
    std::operator+(&mappingId,&connectionId," in component \'");
    NamedEntity::name_abi_cxx11_
              (&connectionDescription,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&owning,&mappingId,&connectionDescription);
    std::operator+(&imported,&owning,"\'");
    std::__cxx11::string::operator=((string *)&info,(string *)&imported);
    std::__cxx11::string::~string((string *)&imported);
    std::__cxx11::string::~string((string *)&owning);
    std::__cxx11::string::~string((string *)&connectionDescription);
    std::__cxx11::string::~string((string *)&mappingId);
    std::__cxx11::string::~string((string *)&connectionId);
    std::__cxx11::string::~string((string *)&connection);
    Reset::resetValue_abi_cxx11_
              (&imported,
               item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    buildMathIdMap(this,&info,idMap,&imported);
    std::__cxx11::string::~string((string *)&imported);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    uVar8 = uVar8 + 1;
  }
  NamedEntity::name_abi_cxx11_
            (&mappingId,
             (NamedEntity *)
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::operator+(&owning,"math in component \'",&mappingId);
  std::operator+(&imported,&owning,"\'");
  std::__cxx11::string::operator=((string *)&info,(string *)&imported);
  std::__cxx11::string::~string((string *)&imported);
  std::__cxx11::string::~string((string *)&owning);
  std::__cxx11::string::~string((string *)&mappingId);
  Component::math_abi_cxx11_
            (&imported,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  buildMathIdMap(this,&info,idMap,&imported);
  std::__cxx11::string::~string((string *)&imported);
  ImportedEntity::importSource((ImportedEntity *)&owning);
  if (owning._M_dataplus._M_p != (pointer)0x0) {
    ImportedEntity::importSource((ImportedEntity *)&mappingId);
    Entity::id_abi_cxx11_(&imported,(Entity *)mappingId._M_dataplus._M_p);
    sVar2 = imported._M_string_length;
    std::__cxx11::string::~string((string *)&imported);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mappingId._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&owning._M_string_length);
    if (sVar2 == 0) goto LAB_00228fb8;
    NamedEntity::name_abi_cxx11_
              (&mappingId,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&owning," - import source for component \'",&mappingId);
    std::operator+(&imported,&owning,"\'");
    std::__cxx11::string::operator=((string *)&info,(string *)&imported);
    std::__cxx11::string::~string((string *)&imported);
    std::__cxx11::string::~string((string *)&owning);
    std::__cxx11::string::~string((string *)&mappingId);
    ImportedEntity::importSource((ImportedEntity *)&owning);
    pVVar9 = (ValidatorImpl *)&imported;
    Entity::id_abi_cxx11_((string *)pVVar9,(Entity *)owning._M_dataplus._M_p);
    addIdMapItem(pVVar9,&imported,&info,idMap);
    std::__cxx11::string::~string((string *)&imported);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&owning._M_string_length);
LAB_00228fb8:
  ComponentEntity::encapsulationId_abi_cxx11_
            (&imported,
             &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ComponentEntity);
  sVar2 = imported._M_string_length;
  std::__cxx11::string::~string((string *)&imported);
  if (sVar2 != 0) {
    ComponentEntity::encapsulationId_abi_cxx11_
              (&imported,
               &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity);
    bVar4 = isValidXmlName(&imported);
    std::__cxx11::string::~string((string *)&imported);
    if (!bVar4) {
      Issue::IssueImpl::create();
      Issue::IssueImpl::setReferenceRule
                ((IssueImpl *)
                 ((item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_ParentedEntity).super_Entity.mPimpl,XML_ID_ATTRIBUTE);
      AnyCellmlElement::AnyCellmlElementImpl::setComponent
                (*(AnyCellmlElementImpl **)
                  ((item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_ParentedEntity).super_Entity.mPimpl[1].mId._M_string_length,component,
                 COMPONENT);
      pIVar1 = (IssueImpl *)
               ((item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_ParentedEntity).super_Entity.mPimpl;
      NamedEntity::name_abi_cxx11_
                (&connection,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+(&connectionId,"Component \'",&connection);
      std::operator+(&mappingId,&connectionId,
                     "\' does not have a valid encapsulation \'id\' attribute, \'");
      ComponentEntity::encapsulationId_abi_cxx11_
                (&connectionDescription,
                 &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ComponentEntity);
      std::operator+(&owning,&mappingId,&connectionDescription);
      std::operator+(&imported,&owning,"\'.");
      Issue::IssueImpl::setDescription(pIVar1,&imported);
      std::__cxx11::string::~string((string *)&imported);
      std::__cxx11::string::~string((string *)&owning);
      std::__cxx11::string::~string((string *)&connectionDescription);
      std::__cxx11::string::~string((string *)&mappingId);
      std::__cxx11::string::~string((string *)&connectionId);
      std::__cxx11::string::~string((string *)&connection);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&item_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&item_1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    NamedEntity::name_abi_cxx11_
              (&mappingId,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&owning," - encapsulation component_ref to component \'",&mappingId);
    std::operator+(&imported,&owning,"\'");
    std::__cxx11::string::operator=((string *)&info,(string *)&imported);
    std::__cxx11::string::~string((string *)&imported);
    std::__cxx11::string::~string((string *)&owning);
    std::__cxx11::string::~string((string *)&mappingId);
    pVVar9 = (ValidatorImpl *)&imported;
    ComponentEntity::encapsulationId_abi_cxx11_
              ((string *)pVVar9,
               &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ComponentEntity);
    addIdMapItem(pVVar9,&imported,&info,idMap);
    std::__cxx11::string::~string((string *)&imported);
  }
  uVar8 = 0;
  while( true ) {
    sVar5 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar5 <= uVar8) break;
    ComponentEntity::component
              ((ComponentEntity *)&imported,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    buildComponentIdMap(this,(ComponentPtr *)&imported,idMap,reportedConnections);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&imported._M_string_length);
    uVar8 = uVar8 + 1;
  }
  std::__cxx11::string::~string((string *)&info);
  return;
}

Assistant:

void Validator::ValidatorImpl::buildComponentIdMap(const ComponentPtr &component, IdMap &idMap, std::set<std::string> &reportedConnections)
{
    std::string info;

    // Component.
    if (!component->id().empty()) {
        std::string imported;
        std::string owning;
        if (component->isImport()) {
            imported = "imported ";
        }
        if (owningComponent(component) != nullptr) {
            owning = "' in component '" + owningComponent(component)->name() + "'";
        } else {
            owning = "' in model '" + owningModel(component)->name() + "'";
        }
        info = " - " + imported + "component '" + component->name() + owning;
        addIdMapItem(component->id(), info, idMap);
    }

    // Variables.
    for (size_t i = 0; i < component->variableCount(); ++i) {
        auto item = component->variable(i);
        if (!item->id().empty()) {
            info = " - variable '" + item->name() + "' in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        // Equivalent variables.
        for (size_t e = 0; e < item->equivalentVariableCount(); ++e) {
            auto equiv = item->equivalentVariable(e);
            auto equivParent = owningComponent(equiv);
            if (equivParent != nullptr) {
                // Skipping half of the equivalences to avoid duplicate reporting.
                std::string s1 = item->name() + component->name();
                std::string s2 = equiv->name() + equivParent->name();
                std::string mappingId = Variable::equivalenceMappingId(item, equiv);
                // Variable mapping.
                if ((s1 < s2) && !mappingId.empty()) {
                    std::string mappingDescription =
                        "between variable '" + item->name() + "' in component '" + component->name()
                        + "' and variable '" + equiv->name() + "' in component '" + equivParent->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(mappingId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setMapVariables(item, equiv);
                        issue->mPimpl->setDescription("Variable equivalence " + mappingDescription + ", does not have a valid map_variables 'id' attribute, '" + mappingId + "'.");
                        addIssue(issue);
                    }

                    info = " - variable equivalence " + mappingDescription;
                    addIdMapItem(mappingId, info, idMap);
                }
                // Connections.
                auto connectionId = Variable::equivalenceConnectionId(item, equiv);
                std::string connection = component->name() < equivParent->name() ? component->name() + equivParent->name() : equivParent->name() + component->name();
                if ((s1 < s2) && !connectionId.empty() && (reportedConnections.count(connection) == 0)) {
                    std::string connectionDescription =
                        "between components '" + component->name() + "' and '" + equivParent->name()
                        + "' because of variable equivalence between variables '" + item->name()
                        + "' and '" + equiv->name() + "'";
                    // Check for a valid identifier.
                    if (!isValidXmlName(connectionId)) {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
                        issue->mPimpl->mItem->mPimpl->setConnection(item, equiv);
                        issue->mPimpl->setDescription("Connection " + connectionDescription + ", does not have a valid connection 'id' attribute, '" + connectionId + "'.");
                        addIssue(issue);
                    }

                    reportedConnections.insert(connection);
                    info = " - connection " + connectionDescription;
                    addIdMapItem(connectionId, info, idMap);
                }
            }
        }
    }

    // Resets.
    for (size_t i = 0; i < component->resetCount(); ++i) {
        auto item = component->reset(i);
        if (!item->id().empty()) {
            info = " - reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->id(), info, idMap);
        }
        if (!item->testValueId().empty()) {
            info = " - test_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->testValueId(), info, idMap);
        }
        info = "test_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->testValue());
        if (!item->resetValueId().empty()) {
            info = " - reset_value in reset at index " + std::to_string(i) + " in component '" + component->name() + "'";
            addIdMapItem(item->resetValueId(), info, idMap);
        }
        info = "reset_value in reset " + std::to_string(i) + " in component '" + component->name() + "'";
        buildMathIdMap(info, idMap, item->resetValue());
    }

    // Maths.
    info = "math in component '" + component->name() + "'";
    buildMathIdMap(info, idMap, component->math());

    // Imports.
    if ((component->importSource() != nullptr) && !component->importSource()->id().empty()) {
        info = " - import source for component '" + component->name() + "'";
        addIdMapItem(component->importSource()->id(), info, idMap);
    }

    // Hierarchy.
    if (!component->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(component->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setComponent(component);
            issue->mPimpl->setDescription("Component '" + component->name() + "' does not have a valid encapsulation 'id' attribute, '" + component->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation component_ref to component '" + component->name() + "'";
        addIdMapItem(component->encapsulationId(), info, idMap);
    }

    // Child components.
    for (size_t c = 0; c < component->componentCount(); ++c) {
        buildComponentIdMap(component->component(c), idMap, reportedConnections);
    }
}